

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenEnum_ObjectAPI
          (CSharpGenerator *this,EnumDef *enum_def,string *code_ptr,IDLOptions *opts)

{
  BaseType BVar1;
  EnumVal *pEVar2;
  StructDef *pSVar3;
  string *psVar4;
  EnumDef *pEVar5;
  CSharpGenerator *this_00;
  __type _Var6;
  pointer ppEVar7;
  Value *pVVar8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string type_name;
  string accessibility;
  string lower_ev_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> union_name;
  string class_member;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string *local_3a8;
  EnumDef *local_3a0;
  allocator<char> local_391;
  CSharpGenerator *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  IDLOptions *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  SymbolTable<flatbuffers::Value> *local_260;
  pointer local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((enum_def->super_Definition).generated == false) && (enum_def->is_union == true)) {
    local_328 = opts;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"private",(allocator<char> *)&local_2e0);
    local_260 = &(enum_def->super_Definition).attributes;
    SymbolTable<flatbuffers::Value>::Lookup(local_260,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def,
                   "Union");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"Value",(allocator<char> *)&local_3e8);
    _Var6 = std::operator==(&local_2e0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            enum_def);
    if (_Var6) {
      std::__cxx11::string::append((char *)&local_2e0);
    }
    std::operator+(&local_3c8,"class ",&local_368);
    std::operator+(&local_3e8,&local_3c8," {\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::operator+(&local_3c8,"  public ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def);
    std::operator+(&local_3e8,&local_3c8," Type { get; set; }\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::operator+(&local_3c8,"  public object ",&local_2e0);
    std::operator+(&local_3e8,&local_3c8," { get; set; }\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_3c8,"  public ",&local_368);
    std::operator+(&local_3e8,&local_3c8,"() {\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::operator+(&local_388,"    this.Type = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def);
    std::operator+(&local_250,&local_388,".");
    std::operator+(&local_3c8,&local_250,
                   &(*(enum_def->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name);
    std::operator+(&local_3e8,&local_3c8,";\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_388);
    std::operator+(&local_3c8,"    this.",&local_2e0);
    std::operator+(&local_3e8,&local_3c8," = null;\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_3c8,"  public T As<T>() where T : class { return this.",&local_2e0);
    std::operator+(&local_3e8,&local_3c8," as T; }\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    ppEVar7 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_3a8 = code_ptr;
    local_3a0 = enum_def;
    local_390 = this;
    while (pEVar5 = local_3a0, psVar4 = local_3a8,
          ppEVar7 !=
          (local_3a0->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
      pEVar2 = *ppEVar7;
      local_258 = ppEVar7;
      if ((pEVar2->union_type).base_type != BASE_TYPE_NONE) {
        GenTypeGet_ObjectAPI_abi_cxx11_(&local_3e8,this,pEVar2->union_type,local_328);
        BVar1 = (pEVar2->union_type).base_type;
        __s = "public";
        if (BVar1 == BASE_TYPE_STRUCT) {
          pSVar3 = (pEVar2->union_type).struct_def;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"private",&local_391);
          pVVar8 = SymbolTable<flatbuffers::Value>::Lookup
                             (&(pSVar3->super_Definition).attributes,&local_250);
          __s = "internal";
          if (pVVar8 == (Value *)0x0) {
            __s = "public";
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,__s,(allocator<char> *)&local_388);
        if (BVar1 == BASE_TYPE_STRUCT) {
          std::__cxx11::string::~string((string *)&local_250);
        }
        std::operator+(&local_210,"  ",&local_3c8);
        this = local_390;
        std::operator+(&local_2a0,&local_210," ");
        std::operator+(&local_2c0,&local_2a0,&local_3e8);
        std::operator+(&local_280,&local_2c0," As");
        std::operator+(&local_320,&local_280,&pEVar2->name);
        std::operator+(&local_300,&local_320,"() { return this.As<");
        std::operator+(&local_348,&local_300,&local_3e8);
        std::operator+(&local_388,&local_348,">(); }\n");
        std::__cxx11::string::append((string *)local_3a8);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::string((string *)&local_388,(string *)pEVar2);
        std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_388._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_388._M_dataplus._M_p + local_388._M_string_length),
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_388._M_dataplus._M_p,CharToLower);
        std::operator+(&local_190,"  ",&local_3c8);
        std::operator+(&local_170,&local_190," static ");
        std::operator+(&local_150,&local_170,&local_368);
        std::operator+(&local_130,&local_150," From");
        std::operator+(&local_110,&local_130,&pEVar2->name);
        std::operator+(&local_f0,&local_110,"(");
        std::operator+(&local_d0,&local_f0,&local_3e8);
        std::operator+(&local_b0,&local_d0," _");
        std::operator+(&local_90,&local_b0,&local_388);
        std::operator+(&local_70,&local_90,") { return new ");
        std::operator+(&local_50,&local_70,&local_368);
        std::operator+(&local_1f0,&local_50,"{ Type = ");
        EscapeKeyword(&local_1b0,this,(string *)local_3a0);
        std::operator+(&local_230,&local_1f0,&local_1b0);
        std::operator+(&local_210,&local_230,".");
        EscapeKeyword(&local_1d0,this,&pEVar2->name);
        std::operator+(&local_2a0,&local_210,&local_1d0);
        std::operator+(&local_2c0,&local_2a0,", ");
        std::operator+(&local_280,&local_2c0,&local_2e0);
        std::operator+(&local_320,&local_280," = _");
        std::operator+(&local_300,&local_320,&local_388);
        std::operator+(&local_348,&local_300," }; }\n");
        std::__cxx11::string::append((string *)local_3a8);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3e8);
      }
      ppEVar7 = local_258 + 1;
    }
    std::__cxx11::string::append((char *)local_3a8);
    std::operator+(&local_3c8,
                   "  public static int Pack(Google.FlatBuffers.FlatBufferBuilder builder, ",
                   &local_368);
    std::operator+(&local_3e8,&local_3c8," _o) {\n");
    std::__cxx11::string::append((string *)psVar4);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::append((char *)psVar4);
    for (ppEVar7 = (pEVar5->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar4 = local_3a8,
        ppEVar7 !=
        (local_3a0->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
      pEVar2 = *ppEVar7;
      if ((pEVar2->union_type).base_type == BASE_TYPE_NONE) {
        std::__cxx11::string::append((char *)local_3a8);
      }
      else {
        EscapeKeyword(&local_300,local_390,(string *)local_3a0);
        std::operator+(&local_348,"      case ",&local_300);
        std::operator+(&local_388,&local_348,".");
        EscapeKeyword(&local_320,local_390,&pEVar2->name);
        std::operator+(&local_3c8,&local_388,&local_320);
        std::operator+(&local_3e8,&local_3c8,": return ");
        std::__cxx11::string::append((string *)local_3a8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_300);
        if ((pEVar2->union_type).base_type == BASE_TYPE_STRING) {
          std::operator+(&local_3c8,"builder.CreateString(_o.As",&pEVar2->name);
          std::operator+(&local_3e8,&local_3c8,"()).Value;\n");
          std::__cxx11::string::append((string *)local_3a8);
          std::__cxx11::string::~string((string *)&local_3e8);
          this_01 = &local_3c8;
        }
        else {
          GenTypeGet_abi_cxx11_(&local_348,local_390,&pEVar2->union_type);
          std::operator+(&local_388,&local_348,".Pack(builder, _o.As");
          std::operator+(&local_3c8,&local_388,&pEVar2->name);
          std::operator+(&local_3e8,&local_3c8,"()).Value;\n");
          std::__cxx11::string::append((string *)local_3a8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_388);
          this_01 = &local_348;
        }
        std::__cxx11::string::~string((string *)this_01);
      }
    }
    std::__cxx11::string::append((char *)local_3a8);
    pEVar5 = local_3a0;
    std::__cxx11::string::append((char *)psVar4);
    std::__cxx11::string::append((char *)psVar4);
    if (local_328->cs_gen_json_serializer == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"private",(allocator<char> *)&local_3c8);
      SymbolTable<flatbuffers::Value>::Lookup(local_260,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_3c8,"class ",&local_368);
      std::operator+(&local_3e8,&local_3c8,"_JsonConverter : Newtonsoft.Json.JsonConverter {\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_348,"    return objectType == typeof(",&local_368);
      std::operator+(&local_388,&local_348,
                     ") || objectType == typeof(System.Collections.Generic.List<");
      std::operator+(&local_3c8,&local_388,&local_368);
      std::operator+(&local_3e8,&local_3c8,">);\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_3c8,"    var _olist = value as System.Collections.Generic.List<",
                     &local_368);
      std::operator+(&local_3e8,&local_3c8,">;\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_3c8,"      this.WriteJson(writer, value as ",&local_368);
      std::operator+(&local_3e8,&local_3c8,", serializer);\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_3c8,"  public void WriteJson(Newtonsoft.Json.JsonWriter writer, ",
                     &local_368);
      std::operator+(&local_3e8,&local_3c8," _o, Newtonsoft.Json.JsonSerializer serializer) {\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_3c8,"    serializer.Serialize(writer, _o.",&local_2e0);
      std::operator+(&local_3e8,&local_3c8,");\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_3c8,"    var _olist = existingValue as System.Collections.Generic.List<"
                     ,&local_368);
      std::operator+(&local_3e8,&local_3c8,">;\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_3c8,"      return this.ReadJson(reader, existingValue as ",&local_368);
      std::operator+(&local_3e8,&local_3c8,", serializer);\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::operator+(&local_348,"  public ",&local_368);
      std::operator+(&local_388,&local_348," ReadJson(Newtonsoft.Json.JsonReader reader, ");
      std::operator+(&local_3c8,&local_388,&local_368);
      std::operator+(&local_3e8,&local_3c8," _o, Newtonsoft.Json.JsonSerializer serializer) {\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      for (ppEVar7 = (pEVar5->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 = local_390,
          psVar4 = local_3a8,
          ppEVar7 !=
          (local_3a0->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
        pEVar2 = *ppEVar7;
        if ((pEVar2->union_type).base_type == BASE_TYPE_NONE) {
          std::__cxx11::string::append((char *)local_3a8);
        }
        else {
          GenTypeGet_ObjectAPI_abi_cxx11_(&local_3e8,local_390,pEVar2->union_type,local_328);
          EscapeKeyword(&local_210,this_00,(string *)local_3a0);
          std::operator+(&local_2a0,"      case ",&local_210);
          std::operator+(&local_2c0,&local_2a0,".");
          EscapeKeyword(&local_230,local_390,&pEVar2->name);
          std::operator+(&local_280,&local_2c0,&local_230);
          std::operator+(&local_320,&local_280,": _o.");
          std::operator+(&local_300,&local_320,&local_2e0);
          std::operator+(&local_348,&local_300," = serializer.Deserialize<");
          std::operator+(&local_388,&local_348,&local_3e8);
          std::operator+(&local_3c8,&local_388,">(reader); break;\n");
          std::__cxx11::string::append((string *)local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_3e8);
        }
      }
      std::__cxx11::string::append((char *)local_3a8);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
      std::__cxx11::string::append((char *)psVar4);
    }
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_368);
  }
  return;
}

Assistant:

void GenEnum_ObjectAPI(EnumDef &enum_def, std::string *code_ptr,
                         const IDLOptions &opts) const {
    auto &code = *code_ptr;
    if (enum_def.generated) return;
    if (!enum_def.is_union) return;
    if (enum_def.attributes.Lookup("private")) {
      code += "internal ";
    } else {
      code += "public ";
    }
    auto union_name = enum_def.name + "Union";
    auto class_member = std::string("Value");
    if (class_member == enum_def.name) { class_member += "_"; };
    code += "class " + union_name + " {\n";
    // Type
    code += "  public " + enum_def.name + " Type { get; set; }\n";
    // Value
    code += "  public object " + class_member + " { get; set; }\n";
    code += "\n";
    // Constructor
    code += "  public " + union_name + "() {\n";
    code += "    this.Type = " + enum_def.name + "." +
            enum_def.Vals()[0]->name + ";\n";
    code += "    this." + class_member + " = null;\n";
    code += "  }\n\n";
    // As<T>
    code += "  public T As<T>() where T : class { return this." + class_member +
            " as T; }\n";
    // As, From
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) continue;
      auto type_name = GenTypeGet_ObjectAPI(ev.union_type, opts);
      std::string accessibility =
          (ev.union_type.base_type == BASE_TYPE_STRUCT &&
           ev.union_type.struct_def->attributes.Lookup("private"))
              ? "internal"
              : "public";
      // As
      code += "  " + accessibility + " " + type_name + " As" + ev.name +
              "() { return this.As<" + type_name + ">(); }\n";
      // From
      auto lower_ev_name = ev.name;
      std::transform(lower_ev_name.begin(), lower_ev_name.end(),
                     lower_ev_name.begin(), CharToLower);
      code += "  " + accessibility + " static " + union_name + " From" +
              ev.name + "(" + type_name + " _" + lower_ev_name +
              ") { return new " + union_name + "{ Type = " + Name(enum_def) +
              "." + Name(ev) + ", " + class_member + " = _" + lower_ev_name +
              " }; }\n";
    }
    code += "\n";
    // Pack()
    code +=
        "  public static int Pack(Google.FlatBuffers.FlatBufferBuilder "
        "builder, " +
        union_name + " _o) {\n";
    code += "    switch (_o.Type) {\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code += "      default: return 0;\n";
      } else {
        code += "      case " + Name(enum_def) + "." + Name(ev) + ": return ";
        if (IsString(ev.union_type)) {
          code += "builder.CreateString(_o.As" + ev.name + "()).Value;\n";
        } else {
          code += GenTypeGet(ev.union_type) + ".Pack(builder, _o.As" + ev.name +
                  "()).Value;\n";
        }
      }
    }
    code += "    }\n";
    code += "  }\n";
    code += "}\n\n";

    // JsonConverter
    if (opts.cs_gen_json_serializer) {
      if (enum_def.attributes.Lookup("private")) {
        code += "internal ";
      } else {
        code += "public ";
      }
      code += "class " + union_name +
              "_JsonConverter : Newtonsoft.Json.JsonConverter {\n";
      code += "  public override bool CanConvert(System.Type objectType) {\n";
      code += "    return objectType == typeof(" + union_name +
              ") || objectType == typeof(System.Collections.Generic.List<" +
              union_name + ">);\n";
      code += "  }\n";
      code +=
          "  public override void WriteJson(Newtonsoft.Json.JsonWriter writer, "
          "object value, "
          "Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    var _olist = value as System.Collections.Generic.List<" +
              union_name + ">;\n";
      code += "    if (_olist != null) {\n";
      code += "      writer.WriteStartArray();\n";
      code +=
          "      foreach (var _o in _olist) { this.WriteJson(writer, _o, "
          "serializer); }\n";
      code += "      writer.WriteEndArray();\n";
      code += "    } else {\n";
      code += "      this.WriteJson(writer, value as " + union_name +
              ", serializer);\n";
      code += "    }\n";
      code += "  }\n";
      code += "  public void WriteJson(Newtonsoft.Json.JsonWriter writer, " +
              union_name +
              " _o, "
              "Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    if (_o == null) return;\n";
      code += "    serializer.Serialize(writer, _o." + class_member + ");\n";
      code += "  }\n";
      code +=
          "  public override object ReadJson(Newtonsoft.Json.JsonReader "
          "reader, "
          "System.Type objectType, "
          "object existingValue, Newtonsoft.Json.JsonSerializer serializer) "
          "{\n";
      code +=
          "    var _olist = existingValue as System.Collections.Generic.List<" +
          union_name + ">;\n";
      code += "    if (_olist != null) {\n";
      code += "      for (var _j = 0; _j < _olist.Count; ++_j) {\n";
      code += "        reader.Read();\n";
      code +=
          "        _olist[_j] = this.ReadJson(reader, _olist[_j], "
          "serializer);\n";
      code += "      }\n";
      code += "      reader.Read();\n";
      code += "      return _olist;\n";
      code += "    } else {\n";
      code += "      return this.ReadJson(reader, existingValue as " +
              union_name + ", serializer);\n";
      code += "    }\n";
      code += "  }\n";
      code += "  public " + union_name +
              " ReadJson(Newtonsoft.Json.JsonReader reader, " + union_name +
              " _o, Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    if (_o == null) return null;\n";
      code += "    switch (_o.Type) {\n";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        auto &ev = **it;
        if (ev.union_type.base_type == BASE_TYPE_NONE) {
          code += "      default: break;\n";
        } else {
          auto type_name = GenTypeGet_ObjectAPI(ev.union_type, opts);
          code += "      case " + Name(enum_def) + "." + Name(ev) + ": _o." +
                  class_member + " = serializer.Deserialize<" + type_name +
                  ">(reader); break;\n";
        }
      }
      code += "    }\n";
      code += "    return _o;\n";
      code += "  }\n";
      code += "}\n\n";
    }
  }